

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api_layer_interface.cpp
# Opt level: O1

XrResult ApiLayerInterface::GetInstanceExtensionProperties
                   (string *openxr_command,char *layer_name,
                   vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>
                   *extension_properties)

{
  ApiLayerManifestFile *pAVar1;
  size_t __n;
  pointer pbVar2;
  XrResult XVar3;
  XrResult XVar4;
  int iVar5;
  XrResult XVar6;
  long lVar7;
  string *enabled_layer;
  pointer pbVar8;
  unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_> *exp_layer_man_file;
  long lVar9;
  undefined8 __args;
  bool bVar10;
  vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
  manifest_files;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  env_enabled_layers;
  vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
  local_98;
  undefined1 local_78 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  undefined8 local_48;
  unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_> *local_38;
  
  local_98.
  super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((layer_name == (char *)0x0) || (*layer_name == '\0')) {
    XVar4 = ApiLayerManifestFile::FindManifestFiles
                      (openxr_command,MANIFEST_TYPE_IMPLICIT_API_LAYER,&local_98);
    if (XR_ERROR_VALIDATION_FAILURE < XVar4) {
      local_78._0_8_ = (pointer)0x0;
      local_78._8_8_ = (pointer)0x0;
      local_78._16_8_ = (pointer)0x0;
      AddEnvironmentApiLayers
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_78);
      if (local_78._0_8_ != local_78._8_8_) {
        local_58._M_allocated_capacity = 0;
        local_58._8_8_ =
             (unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_> *)0x0;
        local_48 = 0;
        XVar4 = ApiLayerManifestFile::FindManifestFiles
                          (openxr_command,MANIFEST_TYPE_EXPLICIT_API_LAYER,
                           (vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                            *)&local_58);
        if ((XR_ERROR_VALIDATION_FAILURE < XVar4) &&
           (local_38 = (unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>
                        *)local_58._8_8_, pbVar8 = (pointer)local_78._0_8_,
           pbVar2 = (pointer)local_78._8_8_, __args = local_58._M_allocated_capacity,
           local_58._M_allocated_capacity != local_58._8_8_)) {
LAB_00106562:
          do {
            if (pbVar8 != pbVar2) {
              do {
                pAVar1 = (((unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>
                            *)__args)->_M_t).
                         super___uniq_ptr_impl<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ApiLayerManifestFile_*,_std::default_delete<ApiLayerManifestFile>_>
                         .super__Head_base<0UL,_ApiLayerManifestFile_*,_false>._M_head_impl;
                __n = pbVar8->_M_string_length;
                if (__n == (pAVar1->_layer_name)._M_string_length) {
                  if (__n == 0) {
                    bVar10 = true;
                  }
                  else {
                    iVar5 = memcmp((pbVar8->_M_dataplus)._M_p,(pAVar1->_layer_name)._M_dataplus._M_p
                                   ,__n);
                    bVar10 = iVar5 == 0;
                  }
                }
                else {
                  bVar10 = false;
                }
                if (!bVar10) {
                  pbVar8 = pbVar8 + 1;
                  goto LAB_00106562;
                }
                std::
                vector<std::unique_ptr<ApiLayerManifestFile,std::default_delete<ApiLayerManifestFile>>,std::allocator<std::unique_ptr<ApiLayerManifestFile,std::default_delete<ApiLayerManifestFile>>>>
                ::
                emplace_back<std::unique_ptr<ApiLayerManifestFile,std::default_delete<ApiLayerManifestFile>>>
                          ((vector<std::unique_ptr<ApiLayerManifestFile,std::default_delete<ApiLayerManifestFile>>,std::allocator<std::unique_ptr<ApiLayerManifestFile,std::default_delete<ApiLayerManifestFile>>>>
                            *)&local_98,
                           (unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>
                            *)__args);
                pbVar8 = pbVar8 + 1;
              } while (!bVar10 && pbVar8 != pbVar2);
            }
            __args = __args + 8;
            pbVar8 = (pointer)local_78._0_8_;
            pbVar2 = (pointer)local_78._8_8_;
          } while ((unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_> *)
                   __args != local_38);
        }
        std::
        vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
        ::~vector((vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                   *)&local_58);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_78);
    }
    if ((long)local_98.
              super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_98.
              super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0) {
      lVar7 = (long)local_98.
                    super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_98.
                    super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3;
      lVar9 = 0;
      do {
        ManifestFile::GetInstanceExtensionProperties
                  (&(local_98.
                     super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar9]._M_t.
                     super___uniq_ptr_impl<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_ApiLayerManifestFile_*,_std::default_delete<ApiLayerManifestFile>_>
                     .super__Head_base<0UL,_ApiLayerManifestFile_*,_false>._M_head_impl)->
                    super_ManifestFile,extension_properties);
        lVar9 = lVar9 + 1;
      } while (lVar7 + (ulong)(lVar7 == 0) != lVar9);
    }
  }
  else {
    XVar3 = ApiLayerManifestFile::FindManifestFiles
                      (openxr_command,MANIFEST_TYPE_IMPLICIT_API_LAYER,&local_98);
    XVar6 = XR_ERROR_API_LAYER_NOT_PRESENT;
    bVar10 = true;
    XVar4 = XVar6;
    if (XR_ERROR_VALIDATION_FAILURE < XVar3) {
      XVar4 = ApiLayerManifestFile::FindManifestFiles
                        (openxr_command,MANIFEST_TYPE_EXPLICIT_API_LAYER,&local_98);
      if (XVar4 < XR_SUCCESS) {
        local_78._0_8_ = (pointer)(local_78 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_78,
                   "ApiLayerInterface::GetInstanceExtensionProperties - failed searching for API layer manifest files"
                   ,"");
        local_58._M_allocated_capacity = 0;
        local_58._8_8_ =
             (unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_> *)0x0;
        local_48 = 0;
        LoaderLogger::LogErrorMessage
                  (openxr_command,(string *)local_78,
                   (vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)&local_58);
        std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector
                  ((vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)&local_58);
        if ((pointer)local_78._0_8_ != (pointer)(local_78 + 0x10)) {
          operator_delete((void *)local_78._0_8_,(ulong)(local_78._16_8_ + 1));
        }
        bVar10 = false;
      }
      else {
        if ((long)local_98.
                  super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_98.
                  super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != 0) {
          lVar9 = (long)local_98.
                        super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_98.
                        super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3;
          lVar7 = 0;
          do {
            iVar5 = std::__cxx11::string::compare
                              ((char *)&(local_98.
                                         super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[lVar7]._M_t.
                                         super___uniq_ptr_impl<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_ApiLayerManifestFile_*,_std::default_delete<ApiLayerManifestFile>_>
                                         .super__Head_base<0UL,_ApiLayerManifestFile_*,_false>.
                                        _M_head_impl)->_layer_name);
            if (iVar5 == 0) {
              ManifestFile::GetInstanceExtensionProperties
                        (&(local_98.
                           super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[lVar7]._M_t.
                           super___uniq_ptr_impl<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_ApiLayerManifestFile_*,_std::default_delete<ApiLayerManifestFile>_>
                           .super__Head_base<0UL,_ApiLayerManifestFile_*,_false>._M_head_impl)->
                          super_ManifestFile,extension_properties);
              bVar10 = true;
              XVar4 = XVar6;
              goto LAB_00106695;
            }
            lVar7 = lVar7 + 1;
          } while (lVar9 + (ulong)(lVar9 == 0) != lVar7);
        }
        bVar10 = false;
        XVar4 = XVar6;
      }
    }
LAB_00106695:
    if (!bVar10) goto LAB_0010669b;
  }
  XVar4 = XR_SUCCESS;
LAB_0010669b:
  std::
  vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
  ::~vector(&local_98);
  return XVar4;
}

Assistant:

XrResult ApiLayerInterface::GetInstanceExtensionProperties(const std::string& openxr_command, const char* layer_name,
                                                           std::vector<XrExtensionProperties>& extension_properties) {
    std::vector<std::unique_ptr<ApiLayerManifestFile>> manifest_files;

    // If a layer name is supplied, only use the information out of that one layer
    if (nullptr != layer_name && 0 != strlen(layer_name)) {
        XrResult result = ApiLayerManifestFile::FindManifestFiles(openxr_command, MANIFEST_TYPE_IMPLICIT_API_LAYER, manifest_files);
        if (XR_SUCCEEDED(result)) {
            // Find any explicit layers which we may need to report information for.
            result = ApiLayerManifestFile::FindManifestFiles(openxr_command, MANIFEST_TYPE_EXPLICIT_API_LAYER, manifest_files);
            if (XR_FAILED(result)) {
                LoaderLogger::LogErrorMessage(
                    openxr_command,
                    "ApiLayerInterface::GetInstanceExtensionProperties - failed searching for API layer manifest files");
                return result;
            }

            bool found = false;
            size_t num_files = manifest_files.size();
            for (size_t man_file = 0; man_file < num_files; ++man_file) {
                // If a layer with the provided name exists, get it's instance extension information.
                if (manifest_files[man_file]->LayerName() == layer_name) {
                    manifest_files[man_file]->GetInstanceExtensionProperties(extension_properties);
                    found = true;
                    break;
                }
            }

            // If nothing found, report 0
            if (!found) {
                return XR_ERROR_API_LAYER_NOT_PRESENT;
            }
        }
        // Otherwise, we want to add only implicit API layers and explicit API layers enabled using the environment variables
    } else {
        XrResult result = ApiLayerManifestFile::FindManifestFiles(openxr_command, MANIFEST_TYPE_IMPLICIT_API_LAYER, manifest_files);
        if (XR_SUCCEEDED(result)) {
            // Find any environmentally enabled explicit layers.  If they're present, treat them like implicit layers
            // since we know that they're going to be enabled.
            std::vector<std::string> env_enabled_layers;
            AddEnvironmentApiLayers(env_enabled_layers);
            if (!env_enabled_layers.empty()) {
                std::vector<std::unique_ptr<ApiLayerManifestFile>> exp_layer_man_files = {};
                result =
                    ApiLayerManifestFile::FindManifestFiles(openxr_command, MANIFEST_TYPE_EXPLICIT_API_LAYER, exp_layer_man_files);
                if (XR_SUCCEEDED(result)) {
                    for (auto& exp_layer_man_file : exp_layer_man_files) {
                        for (std::string& enabled_layer : env_enabled_layers) {
                            // If this is an enabled layer, transfer it over to the manifest list.
                            if (enabled_layer == exp_layer_man_file->LayerName()) {
                                manifest_files.push_back(std::move(exp_layer_man_file));
                                break;
                            }
                        }
                    }
                }
            }
        }

        // Grab the layer instance extensions information
        size_t num_files = manifest_files.size();
        for (size_t man_file = 0; man_file < num_files; ++man_file) {
            manifest_files[man_file]->GetInstanceExtensionProperties(extension_properties);
        }
    }
    return XR_SUCCESS;
}